

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O3

void wait_for_comm_processes(void)

{
  void *__buf;
  undefined2 in_AX;
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  int *piVar4;
  long lVar5;
  undefined8 uStack_38;
  
  uStack_38._0_3_ = CONCAT12(0x57,in_AX);
  uStack_38 = (ulong)(uint3)uStack_38;
  write(UnixPipeOut,(void *)((long)&uStack_38 + 2),6);
  iVar1 = UnixPipeIn;
  sVar3 = read(UnixPipeIn,(void *)((long)&uStack_38 + 2),6);
  if (sVar3 < 0) {
    piVar4 = __errno_location();
    do {
      if ((*piVar4 != 0xb) && (*piVar4 != 4)) {
        perror("reading UnixPipeIn");
        break;
      }
      sVar3 = read(iVar1,(void *)((long)&uStack_38 + 2),6);
    } while (sVar3 < 0);
  }
  iVar1 = CONCAT13(uStack_38._7_1_,
                   CONCAT12(uStack_38._6_1_,uStack_38._2_2_ << 8 | uStack_38._2_2_ >> 8));
  if (iVar1 != 0) {
    __buf = (void *)((long)&uStack_38 + 2);
    do {
      if (0 < (long)NPROCS) {
        lVar5 = 0;
        do {
          if (*(int *)((long)&UJ->PID + lVar5) == iVar1) {
            uVar2 = (uint)uStack_38._5_1_;
            if (uStack_38._4_1_ != 0) {
              uVar2 = (uint)uStack_38._4_1_ << 8;
            }
            *(uint *)((long)&UJ->status + lVar5) = uVar2;
            break;
          }
          lVar5 = lVar5 + 0x18;
        } while ((long)NPROCS * 0x18 != lVar5);
      }
      uStack_38._0_3_ = CONCAT12(0x57,(short)uStack_38);
      uStack_38 = (ulong)(uint3)uStack_38;
      write(UnixPipeOut,__buf,6);
      iVar1 = UnixPipeIn;
      sVar3 = read(UnixPipeIn,__buf,6);
      if (sVar3 < 0) {
        piVar4 = __errno_location();
        do {
          if ((*piVar4 != 0xb) && (*piVar4 != 4)) {
            perror("reading UnixPipeIn");
            break;
          }
          sVar3 = read(iVar1,__buf,6);
        } while (sVar3 < 0);
      }
      iVar1 = CONCAT13(uStack_38._7_1_,
                       CONCAT12(uStack_38._6_1_,uStack_38._2_2_ << 8 | uStack_38._2_2_ >> 8));
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void wait_for_comm_processes(void) {
  int pid;
  int slot;
  unsigned char d[6];

  memset(d, 0, sizeof(d));
  d[0] = 'W';
  write(UnixPipeOut, d, 6);
  SAFEREAD(UnixPipeIn, d, 6);

  pid = (d[0] << 8) | d[1] | (d[4] << 16) | (d[5] << 24);
  while (pid != 0) {
    slot = find_process_slot(pid);
    /* Ignore processes that we didn't start (shouldn't happen but
       occasionally does) */
    if (slot >= 0) {
      if (d[2] == 0) {
        DBPRINT(("Process %d exited status %d\n", pid, d[3]));
        UJ[slot].status = d[3];
      } else {
        DBPRINT(("Process %d terminated with signal %d\n", pid, d[2]));
        UJ[slot].status = (d[2] << 8);
      }
    }
    /* Look for another stopped process. */
    memset(d, 0, sizeof(d));
    d[0] = 'W';
    write(UnixPipeOut, d, 6);
    SAFEREAD(UnixPipeIn, d, 6);

    pid = (d[0] << 8) | d[1] | (d[4] << 16) | (d[5] << 24);
  }
}